

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall punky::par::Parser::Parser(Parser *this,Lexer *lex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unordered_map<punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>,_std::hash<punky::tok::TokenType>,_std::equal_to<punky::tok::TokenType>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>_>
  *this_00;
  unordered_map<punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>,_std::hash<punky::tok::TokenType>,_std::equal_to<punky::tok::TokenType>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>_>
  *this_01;
  pointer pcVar3;
  undefined8 uVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  key_type local_284 [3];
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  _Any_data local_258;
  code *local_248;
  code *pcStack_240;
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *pcStack_1a0;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  paVar1 = &(this->m_lex).m_line.field_2;
  (this->m_lex).m_line._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (lex->m_line)._M_dataplus._M_p;
  paVar2 = &(lex->m_line).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(lex->m_line).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_lex).m_line.field_2 + 8) = uVar4;
  }
  else {
    (this->m_lex).m_line._M_dataplus._M_p = pcVar3;
    (this->m_lex).m_line.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_lex).m_line._M_string_length = (lex->m_line)._M_string_length;
  (lex->m_line)._M_dataplus._M_p = (pointer)paVar2;
  (lex->m_line)._M_string_length = 0;
  (lex->m_line).field_2._M_local_buf[0] = '\0';
  (this->m_lex).m_curr_char = lex->m_curr_char;
  (this->m_lex).m_curr_it._M_current = (lex->m_curr_it)._M_current;
  (this->m_curr_tok).m_type = LeftParen;
  (this->m_curr_tok).m_literal.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->m_peek_tok).m_type = LeftParen;
  (this->m_peek_tok).m_literal.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->m_prefix_parse_fns;
  (this->m_prefix_parse_fns)._M_h._M_buckets = &(this->m_prefix_parse_fns)._M_h._M_single_bucket;
  (this->m_prefix_parse_fns)._M_h._M_bucket_count = 1;
  (this->m_prefix_parse_fns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_prefix_parse_fns)._M_h._M_element_count = 0;
  (this->m_prefix_parse_fns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_prefix_parse_fns)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_prefix_parse_fns)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_01 = &this->m_infix_parse_fns;
  (this->m_infix_parse_fns)._M_h._M_buckets = &(this->m_infix_parse_fns)._M_h._M_single_bucket;
  (this->m_infix_parse_fns)._M_h._M_bucket_count = 1;
  (this->m_infix_parse_fns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_infix_parse_fns)._M_h._M_element_count = 0;
  (this->m_infix_parse_fns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_infix_parse_fns)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_infix_parse_fns)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  consume(this);
  consume(this);
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:27:44)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:27:44)>
             ::_M_manager;
  local_284[0] = Identifier;
  local_58._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:28:37)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:28:37)>
             ::_M_manager;
  local_284[0] = Int;
  local_78._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:29:38)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:29:38)>
             ::_M_manager;
  local_284[0] = Bang;
  local_98._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:30:39)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:30:39)>
             ::_M_manager;
  local_284[0] = Minus;
  local_b8._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  local_d8._8_8_ = 0;
  pcStack_c0 = std::
               _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:31:38)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:31:38)>
             ::_M_manager;
  local_284[0] = True;
  local_d8._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  local_f8._8_8_ = 0;
  pcStack_e0 = std::
               _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:32:39)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:32:39)>
             ::_M_manager;
  local_284[0] = False;
  local_f8._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  local_118._8_8_ = 0;
  pcStack_100 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:33:43)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:33:43)>
              ::_M_manager;
  local_284[0] = LeftParen;
  local_118._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_118);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  local_138._8_8_ = 0;
  pcStack_120 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:34:36)>
                ::_M_invoke;
  local_128 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:34:36)>
              ::_M_manager;
  local_284[0] = If;
  local_138._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  local_158._8_8_ = 0;
  pcStack_140 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:35:38)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:35:38)>
              ::_M_manager;
  local_284[0] = Func;
  local_158._M_unused._M_object = this;
  pmVar5 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  operator=(pmVar5,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>
                    *)&local_158);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  local_178._8_8_ = 0;
  pcStack_160 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:37:37)>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:37:37)>
              ::_M_manager;
  local_284[0] = Plus;
  local_178._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_178);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  local_198._8_8_ = 0;
  pcStack_180 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:40:38)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:40:38)>
              ::_M_manager;
  local_284[0] = Minus;
  local_198._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_198);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  local_1b8._8_8_ = 0;
  pcStack_1a0 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:43:41)>
                ::_M_invoke;
  local_1a8 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:43:41)>
              ::_M_manager;
  local_284[0] = Asterisk;
  local_1b8._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_1b8);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  local_1d8._8_8_ = 0;
  pcStack_1c0 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:46:38)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:46:38)>
              ::_M_manager;
  local_284[0] = Slash;
  local_1d8._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_1d8);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  local_1f8._8_8_ = 0;
  pcStack_1e0 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:49:43)>
                ::_M_invoke;
  local_1e8 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:49:43)>
              ::_M_manager;
  local_284[0] = EqualEqual;
  local_1f8._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_1f8);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  local_218._8_8_ = 0;
  pcStack_200 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:52:42)>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:52:42)>
              ::_M_manager;
  local_284[0] = BangEqual;
  local_218._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_218);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,__destroy_functor);
  }
  local_238._8_8_ = 0;
  pcStack_220 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:55:37)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:55:37)>
              ::_M_manager;
  local_284[0] = Less;
  local_238._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_238);
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,__destroy_functor);
  }
  local_258._8_8_ = 0;
  pcStack_240 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:58:40)>
                ::_M_invoke;
  local_248 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:58:40)>
              ::_M_manager;
  local_284[0] = Greater;
  local_258._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_258);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  local_278._8_8_ = 0;
  pcStack_260 = std::
                _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:61:42)>
                ::_M_invoke;
  local_268 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:61:42)>
              ::_M_manager;
  local_284[0] = LeftParen;
  local_278._M_unused._M_object = this;
  pmVar6 = std::__detail::
           _Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<punky::tok::TokenType,_std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<punky::tok::TokenType>,_std::hash<punky::tok::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,local_284);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::operator=(pmVar6,(function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
                      *)&local_278);
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,__destroy_functor);
  }
  return;
}

Assistant:

Parser::Parser(Lexer lex) :
  m_lex{std::move(lex)}
{
    consume();
    consume();

    register_prefix(TokenType::Identifier, [this] { return parse_identifier(); });
    register_prefix(TokenType::Int, [this] { return parse_int_literal(); });
    register_prefix(TokenType::Bang, [this] { return parse_prefix_expression(); });
    register_prefix(TokenType::Minus, [this] { return parse_prefix_expression(); });
    register_prefix(TokenType::True, [this] { return parse_boolean(); });
    register_prefix(TokenType::False, [this] { return parse_boolean(); });
    register_prefix(TokenType::LeftParen, [this] { return parse_grouped_expression(); });
    register_prefix(TokenType::If, [this] { return parse_if_expression(); });
    register_prefix(TokenType::Func, [this] { return parse_function_literal(); });

    register_infix(TokenType::Plus, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Minus, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Asterisk, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Slash, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::EqualEqual, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::BangEqual, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Less, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Greater, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::LeftParen, [this](ast::ExprNodePtr function) {
        return parse_call_expression(std::move(function));
    });
}